

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_bind_replace.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
BindReplaceDemoFun2::BindReplace
          (BindReplaceDemoFun2 *this,ClientContext *context,TableFunctionBindInput *input)

{
  long *plVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  long lVar3;
  pointer pTVar4;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_80;
  ParsedExpression *local_78;
  long *local_70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_68;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_50 [8];
  
  duckdb::make_uniq<BindReplaceDemoFun2::CustomFunctionData>();
  duckdb::vector<duckdb::Value,_true>::get<true>(*(vector<duckdb::Value,_true> **)input,0);
  lVar3 = duckdb::Value::GetValue<long>();
  if (lVar3 < 0) {
    *(undefined8 *)this = 0;
  }
  else {
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duckdb::Value::Value((Value *)local_50,lVar3);
    duckdb::make_uniq<duckdb::ConstantExpression,duckdb::Value>
              ((duckdb *)&local_78,(Value *)local_50);
    local_80._M_head_impl = local_78;
    local_78 = (ParsedExpression *)0x0;
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_68,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_80);
    if (local_80._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    local_80._M_head_impl = (ParsedExpression *)0x0;
    if (local_78 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
    local_78 = (ParsedExpression *)0x0;
    duckdb::Value::~Value((Value *)local_50);
    duckdb::make_uniq<duckdb::TableFunctionRef>();
    duckdb::
    make_uniq<duckdb::FunctionExpression,char_const(&)[6],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_80,(char (*) [6])0x45cb4e,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_68);
    _Var2._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (ParsedExpression *)0x0;
    pTVar4 = duckdb::
             unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)local_50);
    plVar1 = *(long **)(pTVar4 + 0x68);
    *(ParsedExpression **)(pTVar4 + 0x68) = _Var2._M_head_impl;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (local_80._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    *(TableFunctionRef **)this = local_50[0]._M_head_impl;
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_68);
  }
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 8))();
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

static duckdb::unique_ptr<TableRef> BindReplace(ClientContext &context, TableFunctionBindInput &input) {
		auto result = make_uniq<BindReplaceDemoFun2::CustomFunctionData>();

		auto value = input.inputs[0].GetValue<int64_t>();
		if (value < 0) {
			// Note: we are returning a nullptr in a table function without bind, this will fail
			return nullptr;
		}

		duckdb::vector<duckdb::unique_ptr<ParsedExpression>> children;
		children.push_back(make_uniq<ConstantExpression>(Value(value)));
		auto tf_ref = make_uniq<TableFunctionRef>();
		tf_ref->function = make_uniq<FunctionExpression>("range", std::move(children));

		return std::move(tf_ref);
	}